

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

VkPhysicalDevice __thiscall
VulkanUtilities::VulkanInstance::SelectPhysicalDevice(VulkanInstance *this,uint32_t AdapterId)

{
  VkPhysicalDevice Device_00;
  bool bVar1;
  size_type sVar2;
  const_reference ppVVar3;
  reference ppVVar4;
  undefined8 uVar5;
  char *in_stack_fffffffffffff898;
  code *pcVar6;
  undefined1 local_721;
  uint local_720;
  undefined1 local_719;
  uint local_718;
  undefined1 local_711;
  uint local_710;
  uint local_70c;
  char local_705;
  uint local_704;
  undefined1 local_6fd;
  uint local_6fc;
  undefined1 local_6f8 [8];
  string _msg;
  VkPhysicalDeviceProperties SelectedDeviceProps;
  VkPhysicalDeviceProperties DeviceProps;
  VkPhysicalDevice_T *Device;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *__range2;
  VkPhysicalDevice SelectedPhysicalDevice;
  anon_class_1_0_00000001 IsGraphicsAndComputeQueueSupported;
  VulkanInstance *pVStack_38;
  uint32_t AdapterId_local;
  VulkanInstance *this_local;
  
  __range2 = (vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)0x0;
  SelectedPhysicalDevice._4_4_ = AdapterId;
  pVStack_38 = this;
  sVar2 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::size
                    (&this->m_PhysicalDevices);
  if (AdapterId < sVar2) {
    ppVVar3 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::operator[]
                        (&this->m_PhysicalDevices,(ulong)SelectedPhysicalDevice._4_4_);
    bVar1 = SelectPhysicalDevice::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&SelectedPhysicalDevice + 3),*ppVVar3);
    if (bVar1) {
      ppVVar3 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::operator[]
                          (&this->m_PhysicalDevices,(ulong)SelectedPhysicalDevice._4_4_);
      __range2 = (vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)*ppVVar3;
    }
  }
  if (__range2 == (vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)0x0) {
    __end2 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::begin
                       (&this->m_PhysicalDevices);
    Device = (VkPhysicalDevice_T *)
             std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::end
                       (&this->m_PhysicalDevices);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<VkPhysicalDevice_T_*const_*,_std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>_>
                                       *)&Device), bVar1) {
      ppVVar4 = __gnu_cxx::
                __normal_iterator<VkPhysicalDevice_T_*const_*,_std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>_>
                ::operator*(&__end2);
      Device_00 = *ppVVar4;
      (*vkGetPhysicalDeviceProperties)
                (Device_00,
                 (VkPhysicalDeviceProperties *)
                 &SelectedDeviceProps.sparseProperties.residencyNonResidentStrict);
      bVar1 = SelectPhysicalDevice::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&SelectedPhysicalDevice + 3),Device_00);
      if ((bVar1) &&
         (__range2 = (vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)
                     Device_00, DeviceProps.vendorID == 2)) break;
      __gnu_cxx::
      __normal_iterator<VkPhysicalDevice_T_*const_*,_std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>_>
      ::operator++(&__end2);
    }
  }
  if (__range2 == (vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)0x0) {
    Diligent::LogError<true,char[40]>
              (false,"SelectPhysicalDevice",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x2a5,(char (*) [40])"Failed to find suitable physical device");
  }
  else {
    (*vkGetPhysicalDeviceProperties)
              ((VkPhysicalDevice)__range2,(VkPhysicalDeviceProperties *)((long)&_msg.field_2 + 8));
    local_6fc = (uint)_msg.field_2._8_4_ >> 0x16 & 0x7f;
    local_6fd = 0x2e;
    local_704 = (uint)_msg.field_2._8_4_ >> 0xc & 0x3ff;
    local_705 = '.';
    local_70c = _msg.field_2._8_4_ & 0xfff;
    local_710 = (uint)_msg.field_2._12_4_ >> 0x16 & 0x7f;
    local_711 = 0x2e;
    local_718 = (uint)_msg.field_2._12_4_ >> 0xc & 0x3ff;
    local_719 = 0x2e;
    local_720 = _msg.field_2._12_4_ & 0xfff;
    local_721 = 0x2e;
    Diligent::
    FormatString<char[24],char[256],char[16],unsigned_int,char,unsigned_int,char,unsigned_int,char[18],unsigned_int,char,unsigned_int,char,unsigned_int,char>
              ((string *)local_6f8,(Diligent *)"Using physical device \'",
               (char (*) [24])&SelectedDeviceProps.deviceID,(char (*) [256])"\', API version ",
               (char (*) [16])&local_6fc,(uint *)&local_6fd,(char *)&local_704,(uint *)&local_705,
               (char *)&local_70c,(uint *)", Driver version ",(char (*) [18])&local_710,
               (uint *)&local_711,(char *)&local_718,(uint *)&local_719,(char *)&local_720,
               (uint *)&local_721,in_stack_fffffffffffff898);
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      pcVar6 = (code *)Diligent::DebugMessageCallback;
      uVar5 = std::__cxx11::string::c_str();
      (*pcVar6)(0,uVar5,0);
    }
    std::__cxx11::string::~string((string *)local_6f8);
  }
  return (VkPhysicalDevice)__range2;
}

Assistant:

VkPhysicalDevice VulkanInstance::SelectPhysicalDevice(uint32_t AdapterId) const noexcept(false)
{
    const auto IsGraphicsAndComputeQueueSupported = [](VkPhysicalDevice Device) {
        uint32_t QueueFamilyCount = 0;
        vkGetPhysicalDeviceQueueFamilyProperties(Device, &QueueFamilyCount, nullptr);
        VERIFY_EXPR(QueueFamilyCount > 0);
        std::vector<VkQueueFamilyProperties> QueueFamilyProperties(QueueFamilyCount);
        vkGetPhysicalDeviceQueueFamilyProperties(Device, &QueueFamilyCount, QueueFamilyProperties.data());
        VERIFY_EXPR(QueueFamilyCount == QueueFamilyProperties.size());

        // If an implementation exposes any queue family that supports graphics operations,
        // at least one queue family of at least one physical device exposed by the implementation
        // must support both graphics and compute operations.
        for (const auto& QueueFamilyProps : QueueFamilyProperties)
        {
            if ((QueueFamilyProps.queueFlags & VK_QUEUE_GRAPHICS_BIT) != 0 &&
                (QueueFamilyProps.queueFlags & VK_QUEUE_COMPUTE_BIT) != 0)
            {
                return true;
            }
        }
        return false;
    };

    VkPhysicalDevice SelectedPhysicalDevice = VK_NULL_HANDLE;

    if (AdapterId < m_PhysicalDevices.size() &&
        IsGraphicsAndComputeQueueSupported(m_PhysicalDevices[AdapterId]))
    {
        SelectedPhysicalDevice = m_PhysicalDevices[AdapterId];
    }

    // Select a device that exposes a queue family that supports both compute and graphics operations.
    // Prefer discrete GPU.
    if (SelectedPhysicalDevice == VK_NULL_HANDLE)
    {
        for (auto Device : m_PhysicalDevices)
        {
            VkPhysicalDeviceProperties DeviceProps;
            vkGetPhysicalDeviceProperties(Device, &DeviceProps);

            if (IsGraphicsAndComputeQueueSupported(Device))
            {
                SelectedPhysicalDevice = Device;
                if (DeviceProps.deviceType == VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU)
                    break;
            }
        }
    }

    if (SelectedPhysicalDevice != VK_NULL_HANDLE)
    {
        VkPhysicalDeviceProperties SelectedDeviceProps;
        vkGetPhysicalDeviceProperties(SelectedPhysicalDevice, &SelectedDeviceProps);
        LOG_INFO_MESSAGE("Using physical device '", SelectedDeviceProps.deviceName,
                         "', API version ",
                         VK_API_VERSION_MAJOR(SelectedDeviceProps.apiVersion), '.',
                         VK_API_VERSION_MINOR(SelectedDeviceProps.apiVersion), '.',
                         VK_API_VERSION_PATCH(SelectedDeviceProps.apiVersion),
                         ", Driver version ",
                         VK_API_VERSION_MAJOR(SelectedDeviceProps.driverVersion), '.',
                         VK_API_VERSION_MINOR(SelectedDeviceProps.driverVersion), '.',
                         VK_API_VERSION_PATCH(SelectedDeviceProps.driverVersion), '.');
    }
    else
    {
        LOG_ERROR_AND_THROW("Failed to find suitable physical device");
    }

    return SelectedPhysicalDevice;
}